

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvKrylovDemo_prec.c
# Opt level: O2

int PSolve(sunrealtype tn,N_Vector c,N_Vector fc,N_Vector r,N_Vector z,sunrealtype gamma,
          sunrealtype delta,int lr,void *user_data)

{
  double dVar1;
  uint n;
  uint uVar2;
  uint uVar3;
  int iVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  char cVar7;
  int i;
  int iVar8;
  uint uVar9;
  sunrealtype *psVar10;
  sunrealtype *psVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  ulong uVar16;
  sunrealtype *psVar17;
  ulong uVar18;
  sunrealtype *psVar19;
  char cVar20;
  uint uVar21;
  sunrealtype *psVar22;
  undefined4 in_register_00000084;
  long lVar23;
  ulong uVar24;
  ulong uVar25;
  double dVar26;
  double dVar27;
  sunrealtype local_128 [6];
  sunrealtype gam [6];
  sunrealtype beta2 [6];
  sunrealtype beta [6];
  sunrealtype cof1 [6];
  
  N_VScale(0x3ff0000000000000,r,z,r,z,CONCAT44(in_register_00000084,lr));
  uVar5 = *(undefined8 *)((long)user_data + 0x978);
  psVar10 = (sunrealtype *)N_VGetArrayPointer();
  psVar11 = (sunrealtype *)N_VGetArrayPointer(z);
  n = *(uint *)((long)user_data + 0x40);
  lVar23 = (long)(int)n;
  uVar2 = *(uint *)((long)user_data + 0x50);
  uVar3 = *(uint *)((long)user_data + 0x54);
  lVar12 = (long)*(int *)((long)user_data + 0x44);
  lVar13 = 0;
  uVar24 = 0;
  if (0 < (int)n) {
    uVar24 = (ulong)n;
  }
  for (; uVar24 * 8 - lVar13 != 0; lVar13 = lVar13 + 8) {
    dVar26 = *(double *)((long)user_data + lVar13 + 0x240);
    dVar1 = *(double *)((long)user_data + lVar13 + 0x270);
    dVar27 = 1.0 / ((dVar26 + dVar1) * (gamma + gamma) + 1.0);
    dVar26 = dVar26 * gamma * dVar27;
    *(double *)((long)beta + lVar13) = dVar26;
    *(double *)((long)beta2 + lVar13) = dVar26 + dVar26;
    dVar26 = dVar1 * gamma * dVar27;
    *(double *)((long)gam + lVar13) = dVar26;
    *(double *)((long)local_128 + lVar13) = dVar26 + dVar26;
    *(double *)((long)cof1 + lVar13) = dVar27;
  }
  uVar16 = 0;
  uVar24 = 0;
  if (0 < (int)uVar2) {
    uVar24 = (ulong)uVar2;
  }
  psVar19 = psVar10;
  uVar18 = 0;
  if (0 < (int)uVar3) {
    uVar18 = (ulong)uVar3;
  }
  for (; psVar17 = psVar11, psVar22 = psVar19, uVar25 = uVar24, uVar16 != uVar18;
      uVar16 = uVar16 + 1) {
    while (uVar25 != 0) {
      v_prod(psVar22,cof1,psVar17,n);
      psVar17 = psVar17 + lVar23;
      psVar22 = psVar22 + lVar23;
      uVar25 = uVar25 - 1;
    }
    psVar11 = psVar11 + lVar12;
    psVar19 = psVar19 + lVar12;
  }
  N_VConst(0,z);
  uVar9 = 1;
  do {
    if (uVar9 == 6) {
      iVar8 = *(int *)((long)user_data + 0x5c);
      uVar16 = 0;
      uVar24 = (ulong)*(uint *)((long)user_data + 0x50);
      if ((int)*(uint *)((long)user_data + 0x50) < 1) {
        uVar24 = uVar16;
      }
      lVar12 = (long)*(int *)((long)user_data + 0x48);
      uVar18 = (ulong)*(uint *)((long)user_data + 0x54);
      if ((int)*(uint *)((long)user_data + 0x54) < 1) {
        uVar18 = uVar16;
      }
      lVar13 = 0;
      for (; uVar16 != uVar18; uVar16 = uVar16 + 1) {
        iVar4 = *(int *)((long)user_data + uVar16 * 4 + 0x98);
        iVar15 = (int)lVar13;
        lVar13 = lVar12 * uVar24 + (long)iVar15;
        lVar23 = (long)iVar15 << 3;
        for (uVar25 = 0; uVar24 != uVar25; uVar25 = uVar25 + 1) {
          lVar14 = (long)*(int *)((long)user_data + uVar25 * 4 + 0x80) + (long)iVar4 * (long)iVar8;
          uVar5 = *(undefined8 *)((long)user_data + lVar14 * 8);
          uVar6 = *(undefined8 *)((long)user_data + lVar14 * 8 + 0x20);
          lVar14 = N_VGetArrayPointer(z);
          SUNDlsMat_denseGETRS(uVar5,lVar12,uVar6,lVar14 + lVar23);
          lVar23 = lVar23 + lVar12 * 8;
        }
      }
      return 0;
    }
    if (1 < uVar9) {
      for (uVar16 = 0; uVar16 != uVar18; uVar16 = uVar16 + 1) {
        uVar21 = (uint)(uVar16 == uVar3 - 1) * 3 + 3;
        if (uVar16 == 0) {
          uVar21 = 0;
        }
        if (uVar24 != 0) {
          iVar8 = (*(code *)((long)&DAT_001050c8 + (long)(int)(&DAT_001050c8)[uVar21]))();
          return iVar8;
        }
      }
    }
    psVar11 = psVar10;
    for (uVar16 = 0; uVar16 != uVar18; uVar16 = uVar16 + 1) {
      cVar20 = (uVar16 == uVar3 - 1) * '\x03' + '\x03';
      if (uVar16 == 0) {
        cVar20 = '\0';
      }
      psVar19 = psVar11;
      for (uVar25 = 0; uVar24 != uVar25; uVar25 = uVar25 + 1) {
        cVar7 = (uVar2 - 1 == uVar25) + '\x01';
        if (uVar25 == 0) {
          cVar7 = '\0';
        }
        switch(cVar7 + cVar20) {
        case '\x01':
          psVar17 = psVar19 + -lVar23;
          psVar22 = beta;
          break;
        case '\x02':
          psVar17 = psVar19 + -lVar23;
          psVar22 = beta2;
          break;
        case '\x03':
          goto switchD_00103cb0_caseD_3;
        case '\x04':
          psVar17 = beta;
          goto LAB_00103cf2;
        case '\x05':
          psVar17 = beta2;
LAB_00103cf2:
          v_inc_by_prod(psVar19,psVar17,psVar19 + -lVar23,n);
switchD_00103cb0_caseD_3:
          psVar17 = psVar19 + -lVar12;
          psVar22 = gam;
          break;
        case '\x06':
          goto switchD_00103cb0_caseD_6;
        case '\a':
          psVar17 = beta;
          goto LAB_00103d4d;
        case '\b':
          psVar17 = beta2;
LAB_00103d4d:
          v_inc_by_prod(psVar19,psVar17,psVar19 + -lVar23,n);
switchD_00103cb0_caseD_6:
          psVar17 = psVar19 + -lVar12;
          psVar22 = local_128;
          break;
        default:
          goto switchD_00103cb0_default;
        }
        v_inc_by_prod(psVar19,psVar22,psVar17,n);
switchD_00103cb0_default:
        psVar19 = psVar19 + lVar23;
      }
      psVar11 = psVar11 + lVar12;
    }
    N_VLinearSum(0x3ff0000000000000,0x3ff0000000000000,z,uVar5,z);
    uVar9 = uVar9 + 1;
  } while( true );
}

Assistant:

static int PSolve(sunrealtype tn, N_Vector c, N_Vector fc, N_Vector r, N_Vector z,
                  sunrealtype gamma, sunrealtype delta, int lr, void* user_data)
{
  sunrealtype*** P;
  sunindextype** pivot;
  int jx, jy, igx, igy, iv, ig, *jigx, *jigy, mx, my, ngx, mp;
  WebData wdata;

  wdata = (WebData)user_data;

  N_VScale(ONE, r, z);

  /* call GSIter for Gauss-Seidel iterations */

  GSIter(gamma, z, wdata->tmp, wdata);

  /* Do backsolves for inverse of block-diagonal preconditioner factor */

  P     = wdata->P;
  pivot = wdata->pivot;
  mx    = wdata->mx;
  my    = wdata->my;
  ngx   = wdata->ngx;
  mp    = wdata->mp;
  jigx  = wdata->jigx;
  jigy  = wdata->jigy;

  iv = 0;
  for (jy = 0; jy < my; jy++)
  {
    igy = jigy[jy];
    for (jx = 0; jx < mx; jx++)
    {
      igx = jigx[jx];
      ig  = igx + igy * ngx;
      SUNDlsMat_denseGETRS(P[ig], mp, pivot[ig], &(N_VGetArrayPointer(z)[iv]));
      iv += mp;
    }
  }

  return (0);
}